

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.cpp
# Opt level: O2

bool ReadDSC(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  string *psVar4;
  exception *peVar5;
  ssize_t sVar6;
  uint sector_00;
  Header *__nbytes;
  MemFile *this;
  uint uVar7;
  DSC_SECTOR ds;
  DSC_TRACK dh;
  CylHead cylhead;
  DSC_DATA dd;
  MemFile *local_150;
  undefined8 local_148;
  int offset;
  shared_ptr<Disk> *local_138;
  Sector sector;
  Data data;
  string strPath;
  Track track;
  MemFile file2;
  
  local_138 = disk;
  MemFile::rewind(file,(FILE *)disk);
  psVar4 = MemFile::path_abi_cxx11_(file);
  std::__cxx11::string::string((string *)&strPath,(string *)psVar4);
  file2.m_path._M_dataplus._M_p = (pointer)&file2.m_path.field_2;
  file2.m_path._M_string_length = 0;
  file2.m_path.field_2._M_local_buf[0] = '\0';
  file2.m_filename._M_dataplus._M_p = (pointer)&file2.m_filename.field_2;
  file2.m_filename._M_string_length = 0;
  file2.m_filename.field_2._M_local_buf[0] = '\0';
  file2.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  file2.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  file2.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  file2.m_it._M_current = (uchar *)0x0;
  file2.m_compress = None;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sector,"hdr",(allocator<char> *)&track);
  bVar1 = IsFileExt(&strPath,(string *)&sector);
  std::__cxx11::string::~string((string *)&sector);
  if (bVar1) {
    strPath._M_dataplus._M_p[strPath._M_string_length - 3] =
         strPath._M_dataplus._M_p[strPath._M_string_length - 3] & 0x20U | 0x44;
    strPath._M_dataplus._M_p[strPath._M_string_length - 2] =
         strPath._M_dataplus._M_p[strPath._M_string_length - 2] & 0x20U | 0x53;
    strPath._M_dataplus._M_p[strPath._M_string_length - 1] =
         strPath._M_dataplus._M_p[strPath._M_string_length - 1] & 0x20U | 0x43;
    local_150 = &file2;
    iVar2 = MemFile::open(local_150,(char *)&strPath,1);
    this = file;
    if ((char)iVar2 == '\0') {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar5,(char (*) [28])"missing .dsc companion file");
      __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sector,"dsc",(allocator<char> *)&track);
    bVar1 = IsFileExt(&strPath,(string *)&sector);
    std::__cxx11::string::~string((string *)&sector);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0018cacb;
    }
    strPath._M_dataplus._M_p[strPath._M_string_length - 3] =
         strPath._M_dataplus._M_p[strPath._M_string_length - 3] & 0x20U | 0x48;
    strPath._M_dataplus._M_p[strPath._M_string_length - 2] =
         strPath._M_dataplus._M_p[strPath._M_string_length - 2] & 0x20U | 0x44;
    strPath._M_dataplus._M_p[strPath._M_string_length - 1] =
         strPath._M_dataplus._M_p[strPath._M_string_length - 1] & 0x20U | 0x52;
    this = &file2;
    iVar2 = MemFile::open(this,(char *)&strPath,1);
    local_150 = file;
    if ((char)iVar2 == '\0') {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar5,(char (*) [28])"missing .hdr companion file");
      __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  while( true ) {
    sVar6 = MemFile::read(this,(int)&dh,(void *)0x2,strPath._M_string_length);
    if ((char)sVar6 == '\0') break;
    Track::Track(&track,0);
    CylHead::CylHead(&cylhead,(uint)((byte)dh._0_1_ >> 1),(byte)dh._0_1_ & 1);
    strPath._M_string_length = 0;
    while( true ) {
      sector_00 = (uint)strPath._M_string_length;
      if (dh.sectors <= sector_00) break;
      sVar6 = MemFile::read(this,(int)&ds,(void *)0x6,1);
      if ((int)sVar6 == 0) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        sector.header._0_8_ = CHS(cylhead.cyl,cylhead.head,sector_00);
        util::exception::exception<char_const(&)[22],char_const*>
                  (peVar5,(char (*) [22])"short file reading %s",(char **)&sector);
        __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      Header::Header((Header *)&data,(uint)ds.cyl,(uint)ds.head,(uint)ds.sector,(uint)ds.size);
      Sector::Sector(&sector,_250K,MFM,(Header *)&data,0);
      __nbytes = (Header *)(ulong)(ds.flags & 0xfd);
      if ((ds.flags & 0xfd) != 0) {
        local_148 = (char *)(CONCAT44(local_148._4_4_,(uint)ds.flags) & 0xffffffff000000fd);
        data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CHSR(cylhead.cyl,cylhead.head,sector_00,(uint)ds.sector);
        __nbytes = (Header *)&data;
        Message<int,char_const*>
                  (msgWarning,"unknown flags [%02X] for %s",(int *)&local_148,(char **)&data);
      }
      if ((ds.flags & 2) == 0) {
        sVar6 = MemFile::read(this,(int)&dd,(void *)0x3,(size_t)__nbytes);
        if ((char)sVar6 == '\0') {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CHSR(cylhead.cyl,cylhead.head,sector_00,sector.header.sector);
          util::exception::exception<char_const(&)[20],char_const*>
                    (peVar5,(char (*) [20])"short file reading ",(char **)&data);
          __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar7 = (uint)dd.bOff256 << 8 | (uint)(ushort)dd._1_2_ << 0x10;
        offset = uVar7;
        uVar3 = MemFile::tell(local_150);
        if (uVar7 != uVar3) {
          iVar2 = MemFile::tell(local_150);
          data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar2);
          Message<int&,int>(msgWarning,"header offset (%lu) != data pointer (%lu)",&offset,
                            (int *)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                           );
        }
        iVar2 = Sector::size(&sector);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)iVar2,
                   (allocator_type *)&local_148);
        bVar1 = MemFile::read<Data>(local_150,
                                    (Data *)&data.
                                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                   );
        if (!bVar1) {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          local_148 = CHSR(cylhead.cyl,cylhead.head,sector_00,sector.header.sector);
          util::exception::exception<char_const(&)[27],char_const*>
                    (peVar5,(char (*) [27])"short file reading %s data",(char **)&local_148);
          __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        Sector::add(&sector,(Data *)&data.
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                    false,0xfb);
      }
      else {
        iVar2 = Sector::size(&sector);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,(long)iVar2,
                   &ds.fill,(allocator_type *)&local_148);
        Sector::add(&sector,&data,false,0xfb);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      Track::add(&track,&sector);
      std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
      strPath._M_string_length = (size_type)(sector_00 + 1);
    }
    Disk::write((local_138->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                (int)&cylhead,&track,strPath._M_string_length);
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
  }
  bVar1 = true;
  std::__cxx11::string::assign
            ((char *)&((local_138->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      strType);
LAB_0018cacb:
  MemFile::~MemFile(&file2);
  std::__cxx11::string::~string((string *)&strPath);
  return bVar1;
}

Assistant:

bool ReadDSC(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    // ToDo: std::string for file extension
    std::string strPath = file.path();
    MemFile file2;
    MemFile* pfileHeader = &file, * pfileData = &file2;

    // If we've been given the header, open the data file
    if (IsFileExt(strPath, "hdr"))
    {
        // HDR->DSC (preserving case)
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'D' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'S' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'C' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .dsc companion file");
    }
    // Or if given the data file, switch to the header
    else if (IsFileExt(strPath, "dsc"))
    {
        // DSC->HDR
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'H' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'D' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'R' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .hdr companion file");

        std::swap(pfileHeader, pfileData);
    }
    // Reject other file extensions
    else
        return false;

    for (;;)
    {
        DSC_TRACK dh;
        if (!pfileHeader->read(&dh, sizeof(dh)))
            break;

        Track track;
        CylHead cylhead(dh.cyl, dh.head);

        for (int i = 0; i < dh.sectors; ++i)
        {
            DSC_SECTOR ds;
            if (!pfileHeader->read(&ds, sizeof(ds), 1))
                throw util::exception("short file reading %s", CHS(cylhead.cyl, cylhead.head, i));

            Sector sector(DataRate::_250K, Encoding::MFM, Header(ds.cyl, ds.head, ds.sector, ds.size));

            if (ds.flags & ~0x02)
                Message(msgWarning, "unknown flags [%02X] for %s", ds.flags & ~0x02, CHSR(cylhead.cyl, cylhead.head, i, ds.sector));

            // b1 of flags indicates fill byte
            if (ds.flags & 0x02)
                sector.add(Data(sector.size(), ds.fill));
            else
            {
                DSC_DATA dd;
                if (!pfileHeader->read(&dd, sizeof(dd)))
                    throw util::exception("short file reading ", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));

                auto offset = (dd.bOff16M << 24) | (dd.bOff64K << 16) | (dd.bOff256 << 8);
                if (offset != pfileData->tell())
                    Message(msgWarning, "header offset (%lu) != data pointer (%lu)", offset, pfileData->tell());

                Data data(sector.size());
                if (!pfileData->read(data))
                    throw util::exception("short file reading %s data", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));
                sector.add(std::move(data));
            }

            track.add(std::move(sector));
        }

        disk->write(cylhead, std::move(track));
    }

    disk->strType = "DSC";
    return true;
}